

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

void free_tree(dtree_t *tr)

{
  dtree_node_t *pdVar1;
  dtree_node_t *node;
  uint32 i;
  dtree_t *tr_local;
  
  for (node._4_4_ = 0; node._4_4_ < tr->n_node; node._4_4_ = node._4_4_ + 1) {
    pdVar1 = tr->node;
    if (pdVar1[node._4_4_].mixw_occ != (float32 ***)0x0) {
      ckd_free_3d(pdVar1[node._4_4_].mixw_occ);
    }
    if (pdVar1[node._4_4_].means != (float32 ***)0x0) {
      ckd_free_3d(pdVar1[node._4_4_].means);
    }
    if (pdVar1[node._4_4_].vars != (float32 ***)0x0) {
      ckd_free_3d(pdVar1[node._4_4_].vars);
    }
    if (pdVar1[node._4_4_].id != (uint32 *)0x0) {
      ckd_free(pdVar1[node._4_4_].id);
    }
  }
  ckd_free(tr->node);
  ckd_free(tr);
  return;
}

Assistant:

void
free_tree(dtree_t *tr)
{
    uint32 i;
    dtree_node_t *node;

    for (i = 0; i < tr->n_node; i++) {
	node = &tr->node[i];

	if (node->mixw_occ)
	    ckd_free_3d((void ***)node->mixw_occ);
	if (node->means)
	    ckd_free_3d((void ***)node->means);
	if (node->vars)
	    ckd_free_3d((void ***)node->vars);
	if (node->id)
	    ckd_free(node->id);

	/* node->q not freed because if tr is a
	   simple tree, it points to the question
	   in the master list of questions that needs
	   to stick around */
    }

    ckd_free(tr->node);

    ckd_free(tr);
}